

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O3

void gba_system_step(void)

{
  arm7tdmi_t *state;
  int iVar1;
  uint uVar2;
  int iVar3;
  gba_apu_t *apu;
  bool bVar4;
  
  state = cpu;
  cpu_stepped = false;
  bVar4 = ((bus->interrupt_enable).raw & (bus->IF).raw) != 0;
  cpu->irq = bVar4;
  iVar1 = 1;
  if ((~state->halt & 1U) != 0 || bVar4) {
    cpu_stepped = true;
    iVar1 = arm7tdmi_step(state);
  }
  timer_tick(iVar1);
  bVar4 = SCARRY4(iVar1,cycles);
  iVar1 = iVar1 + cycles;
  apu = ::apu;
  cycles = iVar1;
  if (iVar1 != 0 && bVar4 == iVar1 < 0) {
    do {
      uVar2 = apu->apu_cycle_counter + 1;
      cycles = iVar1;
      apu->apu_cycle_counter = uVar2;
      iVar3 = iVar1;
      if (0x15d < uVar2) {
        apu->apu_cycle_counter = 0;
        apu_push_sample(apu);
        apu = ::apu;
        iVar3 = cycles;
      }
      iVar1 = iVar3 + -1;
      cycles = iVar1;
    } while (1 < iVar3);
  }
  return;
}

Assistant:

INLINE int inline_gba_cpu_step() {
    cpu_stepped = false;
    cpu->irq = (bus->interrupt_enable.raw & bus->IF.raw) != 0;
    if (cpu->halt && !cpu->irq) {
        return 1;
    } else {
        cpu_stepped = true;
        return arm7tdmi_step(cpu);
    }
}